

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

void __thiscall
despot::PlannerBase::OptionParse
          (PlannerBase *this,Option *options,int *num_runs,string *world_type,string *belief_type,
          int *time_limit,string *solver_type,bool *search_solver)

{
  int iVar1;
  Option *pOVar2;
  double dVar3;
  __type _Var4;
  int local_4c;
  int verbosity;
  long range;
  long millis;
  int *time_limit_local;
  string *belief_type_local;
  string *world_type_local;
  int *num_runs_local;
  Option *options_local;
  PlannerBase *this_local;
  
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x19);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278ac0 = 1;
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 4);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a70 = atoi(options[4].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 5);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a78 = atof(options[5].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 8);
  if (pOVar2 == (Option *)0x0) {
    dVar3 = get_time_second();
    _Var4 = std::pow<double,int>(10.0,9);
    DAT_00278a90 = (int)((long)dVar3 * 1000) -
                   (int)(((long)dVar3 * 1000) / (long)_Var4) * (int)(long)_Var4;
  }
  else {
    DAT_00278a90 = atoi(options[8].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 9);
  if (pOVar2 != (Option *)0x0) {
    Globals::config = atof(options[9].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 10);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a6c = atoi(options[10].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0xb);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a80 = atof(options[0xb].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0xc);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a88 = atof(options[0xc].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0xd);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a68 = atoi(options[0xd].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0xe);
  if (pOVar2 != (Option *)0x0) {
    std::__cxx11::string::operator=((string *)world_type,options[0xe].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0xf);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278a74 = atoi(options[0xf].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x10);
  if (pOVar2 != (Option *)0x0) {
    std::__cxx11::string::operator=((string *)&DAT_00278a98,options[0x10].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x11);
  if (pOVar2 != (Option *)0x0) {
    iVar1 = atoi(options[0x11].arg);
    *num_runs = iVar1;
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x16);
  if (pOVar2 != (Option *)0x0) {
    std::__cxx11::string::operator=((string *)belief_type,options[0x16].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x1b);
  if (pOVar2 != (Option *)0x0) {
    iVar1 = atoi(options[0x1b].arg);
    *time_limit = iVar1;
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x1c);
  if (pOVar2 != (Option *)0x0) {
    DAT_00278ab8 = atof(options[0x1c].arg);
  }
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x1d);
  *search_solver = pOVar2 != (Option *)0x0;
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x1a);
  if (pOVar2 != (Option *)0x0) {
    std::__cxx11::string::operator=((string *)solver_type,options[0x1a].arg);
  }
  local_4c = 0;
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x18);
  if (pOVar2 != (Option *)0x0) {
    local_4c = atoi(options[0x18].arg);
  }
  logging::level(local_4c);
  return;
}

Assistant:

void PlannerBase::OptionParse(option::Option *options, int &num_runs,
		string &world_type, string &belief_type, int &time_limit,
		string &solver_type, bool &search_solver) {
	if (options[E_SILENCE])
		Globals::config.silence = true;

	if (options[E_DEPTH])
		Globals::config.search_depth = atoi(options[E_DEPTH].arg);

	if (options[E_DISCOUNT])
		Globals::config.discount = atof(options[E_DISCOUNT].arg);

	if (options[E_SEED])
		Globals::config.root_seed = atoi(options[E_SEED].arg);
	else { // last 9 digits of current time in milli second
		long millis = (long) get_time_second() * 1000;
		long range = (long) pow((double) 10, (int) 9);
		Globals::config.root_seed = (unsigned int) (millis
				- (millis / range) * range);
	}

	if (options[E_TIMEOUT])
		Globals::config.time_per_move = atof(options[E_TIMEOUT].arg);

	if (options[E_NUMPARTICLES])
		Globals::config.num_scenarios = atoi(options[E_NUMPARTICLES].arg);

	if (options[E_PRUNE])
		Globals::config.pruning_constant = atof(options[E_PRUNE].arg);

	if (options[E_GAP])
		Globals::config.xi = atof(options[E_GAP].arg);

	if (options[E_SIM_LEN])
		Globals::config.sim_len = atoi(options[E_SIM_LEN].arg);

	if (options[E_WORLD])
		world_type = options[E_WORLD].arg;

	if (options[E_MAX_POLICY_SIM_LEN])
		Globals::config.max_policy_sim_len = atoi(
				options[E_MAX_POLICY_SIM_LEN].arg);

	if (options[E_DEFAULT_ACTION])
		Globals::config.default_action = options[E_DEFAULT_ACTION].arg;

	if (options[E_RUNS])
		num_runs = atoi(options[E_RUNS].arg);

	if (options[E_BELIEF])
		belief_type = options[E_BELIEF].arg;

	if (options[E_TIME_LIMIT])
		time_limit = atoi(options[E_TIME_LIMIT].arg);

	if (options[E_NOISE])
		Globals::config.noise = atof(options[E_NOISE].arg);

	search_solver = options[E_SEARCH_SOLVER];

	if (options[E_SOLVER])
		solver_type = options[E_SOLVER].arg;

	int verbosity = 0;
	if (options[E_VERBOSITY])
		verbosity = atoi(options[E_VERBOSITY].arg);
	logging::level(verbosity);
}